

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanContentCharList(QXmlStreamReaderPrivate *this)

{
  QString *this_00;
  qsizetype from;
  long lVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long in_FS_OFFSET;
  QStringView s;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->textBuffer;
  lVar6 = 0;
LAB_0039a944:
  do {
    lVar4 = (this->putStack).tos;
    if (lVar4 == -1) {
      lVar4 = this->readBufferPos;
      if ((this->readBuffer).d.size <= lVar4) {
        uVar7 = getChar_helper(this);
        goto LAB_0039a9a7;
      }
      this->readBufferPos = lVar4 + 1;
      uVar7 = (uint)(ushort)(this->readBuffer).d.ptr[lVar4];
    }
    else {
      if (this->atEnd != false) goto LAB_0039ad0e;
      uVar7 = (this->putStack).data[lVar4];
      (this->putStack).tos = lVar4 + -1;
LAB_0039a9a7:
      if (uVar7 == 0xffffffff) goto LAB_0039ad0e;
    }
    uVar2 = uVar7 & 0xffff;
    if (uVar2 < 0x26) {
      if (uVar2 < 0xd) {
        if (uVar2 != 9) {
          if (uVar2 == 10) goto LAB_0039ac57;
          if (uVar2 != 0) goto LAB_0039ab6f;
          break;
        }
      }
      else {
        if (uVar2 != 0xd) {
          if (uVar2 != 0x20) goto LAB_0039ab6f;
          goto LAB_0039ac73;
        }
        lVar4 = (this->putStack).tos;
        if (lVar4 == -1) {
          if (this->readBufferPos < (this->readBuffer).d.size) {
            uVar2 = (uint)(ushort)(this->readBuffer).d.ptr[this->readBufferPos];
            goto LAB_0039ac23;
          }
          uVar2 = getChar_helper(this);
          if (uVar2 != 0xffffffff) {
            this->readBufferPos = this->readBufferPos + -1;
            goto LAB_0039ac23;
          }
LAB_0039ad32:
          puVar3 = (this->putStack).data;
          lVar5 = (this->putStack).tos;
          lVar4 = lVar5 + 1;
          lVar1 = (this->putStack).cap;
          if (lVar1 <= lVar4) {
            lVar5 = lVar5 + 2;
            lVar4 = lVar1 * 2;
            if (lVar5 != lVar4 && SBORROW8(lVar5,lVar4) == lVar5 + lVar1 * -2 < 0) {
              lVar4 = lVar5;
            }
            (this->putStack).cap = lVar4;
            puVar3 = (uint *)realloc(puVar3,lVar4 << 2);
            (this->putStack).data = puVar3;
            if (puVar3 == (uint *)0x0) goto LAB_0039ae11;
            lVar4 = (this->putStack).tos + 1;
          }
          (this->putStack).tos = lVar4;
          puVar3[lVar4] = 0xd;
          goto LAB_0039ad0e;
        }
        uVar2 = (this->putStack).data[lVar4];
LAB_0039ac23:
        uVar7 = 10;
        if (uVar2 == 10) {
          lVar4 = (this->putStack).tos;
          if (lVar4 == -1) {
            this->readBufferPos = this->readBufferPos + 1;
          }
          else {
            (this->putStack).tos = lVar4 + -1;
          }
        }
        else if (uVar2 == 0xffffffff) goto LAB_0039ad32;
LAB_0039ac57:
        this->lineNumber = this->lineNumber + 1;
        this->lastLineStart = this->readBufferPos + this->characterOffset;
      }
    }
    else {
      if (uVar2 < 0x5d) {
        if ((uVar2 != 0x26) && (uVar2 != 0x3c)) goto LAB_0039ab6f;
        if ((uVar7 & 0xff0000) == 0) break;
      }
      else {
        if (uVar2 == 0x5d) {
          this->field_0x3a8 = this->field_0x3a8 & 0xfd;
          from = (this->textBuffer).d.size;
          do {
            QString::append(this_00,(QChar)0x5d);
            lVar6 = lVar6 + 1;
            lVar4 = (this->putStack).tos;
            if (lVar4 == -1) {
              lVar4 = this->readBufferPos;
              if (lVar4 < (this->readBuffer).d.size) {
                this->readBufferPos = lVar4 + 1;
                uVar7 = (uint)(ushort)(this->readBuffer).d.ptr[lVar4];
              }
              else {
                uVar7 = getChar_helper(this);
              }
            }
            else {
              if (this->atEnd != false) goto LAB_0039ac85;
              uVar7 = (this->putStack).data[lVar4];
              (this->putStack).tos = lVar4 + -1;
            }
          } while (uVar7 == 0x5d);
          if (uVar7 == 0x3e) {
            if ((this->textBuffer).d.ptr[(this->textBuffer).d.size + -2] == L']') {
              QCoreApplication::translate
                        (&local_48,"QXmlStream","Sequence \']]>\' not allowed in content.",
                         (char *)0x0,-1);
              this->error = NotWellFormedError;
              QString::operator=(&this->errorString,&local_48);
              this->type = Invalid;
              if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
                }
              }
              goto LAB_0039ad0e;
            }
            puVar3 = (this->putStack).data;
            lVar5 = (this->putStack).tos;
            lVar4 = lVar5 + 1;
            lVar1 = (this->putStack).cap;
            if (lVar1 <= lVar4) {
              lVar5 = lVar5 + 2;
              lVar4 = lVar1 * 2;
              if (lVar5 != lVar4 && SBORROW8(lVar5,lVar4) == lVar5 + lVar1 * -2 < 0) {
                lVar4 = lVar5;
              }
              (this->putStack).cap = lVar4;
              puVar3 = (uint *)realloc(puVar3,lVar4 << 2);
              (this->putStack).data = puVar3;
              if (puVar3 == (uint *)0x0) goto LAB_0039ae11;
              lVar4 = (this->putStack).tos + 1;
            }
            (this->putStack).tos = lVar4;
            puVar3[lVar4] = 0x3e;
          }
          else {
            if (uVar7 == 0xffffffff) {
LAB_0039ac85:
              s.m_data = (this->textBuffer).d.ptr;
              s.m_size = (this->textBuffer).d.size;
              putString(this,s,from);
              QString::resize(this_00,from);
              goto LAB_0039ad0e;
            }
            puVar3 = (this->putStack).data;
            lVar5 = (this->putStack).tos;
            lVar4 = lVar5 + 1;
            lVar1 = (this->putStack).cap;
            if (lVar1 <= lVar4) {
              lVar5 = lVar5 + 2;
              lVar4 = lVar1 * 2;
              if (lVar5 != lVar4 && SBORROW8(lVar5,lVar4) == lVar5 + lVar1 * -2 < 0) {
                lVar4 = lVar5;
              }
              (this->putStack).cap = lVar4;
              puVar3 = (uint *)realloc(puVar3,lVar4 << 2);
              (this->putStack).data = puVar3;
              if (puVar3 == (uint *)0x0) goto LAB_0039ae11;
              lVar4 = (this->putStack).tos + 1;
            }
            (this->putStack).tos = lVar4;
            puVar3[lVar4] = uVar7;
          }
          goto LAB_0039a944;
        }
        if (uVar2 - 0xfffe < 2) break;
LAB_0039ab6f:
        if (uVar7 < 0x20) break;
      }
      this->field_0x3a8 = this->field_0x3a8 & 0xfd;
    }
LAB_0039ac73:
    QString::append(this_00,(QChar)(char16_t)uVar7);
    lVar6 = lVar6 + 1;
  } while( true );
  puVar3 = (this->putStack).data;
  lVar5 = (this->putStack).tos;
  lVar4 = lVar5 + 1;
  lVar1 = (this->putStack).cap;
  if (lVar1 <= lVar4) {
    lVar5 = lVar5 + 2;
    lVar4 = lVar1 * 2;
    if (lVar5 != lVar4 && SBORROW8(lVar5,lVar4) == lVar5 + lVar1 * -2 < 0) {
      lVar4 = lVar5;
    }
    (this->putStack).cap = lVar4;
    puVar3 = (uint *)realloc(puVar3,lVar4 << 2);
    (this->putStack).data = puVar3;
    if (puVar3 == (uint *)0x0) {
LAB_0039ae11:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        qBadAlloc();
      }
      goto LAB_0039ae26;
    }
    lVar4 = (this->putStack).tos + 1;
  }
  (this->putStack).tos = lVar4;
  puVar3[lVar4] = uVar7;
LAB_0039ad0e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return lVar6;
  }
LAB_0039ae26:
  __stack_chk_fail();
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanContentCharList()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        switch (ushort(c)) {
        case 0xfffe:
        case 0xffff:
        case 0:
            putChar(c);
            return n;
        case ']': {
            isWhitespace = false;
            const qsizetype pos = textBuffer.size();
            textBuffer += QChar(ushort(c));
            ++n;
            while ((c = getChar()) == ']') {
                textBuffer += QChar(ushort(c));
                ++n;
            }
            if (c == StreamEOF) {
                putString(textBuffer, pos);
                textBuffer.resize(pos);
            } else if (c == '>' && textBuffer.at(textBuffer.size() - 2) == u']') {
                raiseWellFormedError(QXmlStream::tr("Sequence ']]>' not allowed in content."));
            } else {
                putChar(c);
                break;
            }
            return n;
        } break;
        case '\r':
            if ((c = filterCarriageReturn()) == 0)
                return n;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case ' ':
        case '\t':
            textBuffer += QChar(ushort(c));
            ++n;
            break;
        case '&':
        case '<':
            if (!(c & 0xff0000)) {
                putChar(c);
                return n;
            }
            Q_FALLTHROUGH();
        default:
            if (c < 0x20) {
                putChar(c);
                return n;
            }
            isWhitespace = false;
            textBuffer += QChar(ushort(c));
            ++n;
        }
    }
    return n;
}